

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O2

int P_TranslateSectorSpecial(int special)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = 0;
  uVar2 = SectorMasks.Count;
  while (uVar2 = uVar2 - 1, -1 < (int)uVar2) {
    uVar3 = uVar2 & 0x7fffffff;
    uVar5 = SectorMasks.Array[uVar3].mask & special;
    if (uVar5 != 0) {
      iVar1 = SectorMasks.Array[uVar3].op;
      if (iVar1 == -1) {
        uVar6 = (int)uVar5 >> ((byte)SectorMasks.Array[uVar3].shift & 0x1f);
      }
      else {
        uVar6 = uVar5;
        if (iVar1 == 0) {
          if (SectorMasks.Array[uVar3].shift == 1) {
            uVar6 = 0;
          }
        }
        else if (iVar1 == 1) {
          uVar6 = uVar5 << ((byte)SectorMasks.Array[uVar3].shift & 0x1f);
        }
      }
      special = special ^ uVar5;
      uVar4 = uVar4 | uVar6;
    }
  }
  uVar2 = special;
  if (((uint)special < SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Count) &&
     ((SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array[special].bitmask_allowed !=
       false || (uVar2 = 0, uVar4 == 0)))) {
    uVar2 = SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array[special].newtype;
  }
  return uVar2 | uVar4;
}

Assistant:

int P_TranslateSectorSpecial (int special)
{
	int mask = 0;

	for(int i = SectorMasks.Size()-1; i>=0; i--)
	{
		int newmask = special & SectorMasks[i].mask;
		if (newmask)
		{
			special &= ~newmask;
			if (SectorMasks[i].op == 1)
				newmask <<= SectorMasks[i].shift;
			else if (SectorMasks[i].op == -1)
				newmask >>= SectorMasks[i].shift;
			else if (SectorMasks[i].op == 0 && SectorMasks[i].shift == 1)
				newmask = 0;
			mask |= newmask;
		}
	}
	
	if ((unsigned)special < SectorTranslations.Size())
	{
		if (!SectorTranslations[special].bitmask_allowed && mask)
			special = 0;
		else
			special = SectorTranslations[special].newtype;
	}
	return special | mask;
}